

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void __thiscall LiteScript::Memory::GarbageCollector(Memory *this,State *state)

{
  State **sarray;
  value_type local_38;
  undefined1 local_30 [8];
  vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_> tmp;
  State *state_local;
  Memory *this_local;
  
  tmp.super__Vector_base<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)state;
  std::vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>::vector
            ((vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_> *)
             local_30);
  local_38 = (value_type)
             tmp.
             super__Vector_base<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>::push_back
            ((vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_> *)
             local_30,&local_38);
  sarray = std::vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>::data
                     ((vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>
                       *)local_30);
  GarbageCollector(this,1,sarray);
  std::vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>::~vector
            ((vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_> *)
             local_30);
  return;
}

Assistant:

void LiteScript::Memory::GarbageCollector(const State& state) {
    std::vector<const State *> tmp;
    tmp.push_back(&state);
    this->GarbageCollector(1, tmp.data());
}